

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O1

UBool isSpecialTypeRgKeyValue(char *val)

{
  char c;
  UBool UVar1;
  char *p;
  long lVar2;
  
  c = *val;
  if (c == '\0') {
    return '\0';
  }
  lVar2 = 0;
  while ((((uint)lVar2 < 2 && (UVar1 = uprv_isASCIILetter_63(c), UVar1 != '\0')) ||
         ((1 < (uint)lVar2 && ((byte)(val[lVar2] | 0x20U) == 0x7a))))) {
    c = val[lVar2 + 1];
    lVar2 = lVar2 + 1;
    if (c == '\0') {
      return (int)lVar2 == 6;
    }
  }
  return '\0';
}

Assistant:

static UBool
isSpecialTypeRgKeyValue(const char* val) {
    int32_t subtagLen = 0;
    const char* p = val;
    while (*p) {
        if ( (subtagLen < 2 && uprv_isASCIILetter(*p)) ||
                    (subtagLen >= 2 && (*p == 'Z' || *p == 'z')) ) {
            subtagLen++;
        } else {
            return FALSE;
        }
        p++;
    }
    return (subtagLen == 6);
}